

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O1

void * __thiscall
MmapSysAllocator::Alloc(MmapSysAllocator *this,size_t size,size_t *actual_size,size_t alignment)

{
  int iVar1;
  void *pvVar2;
  void *__addr;
  ulong uVar3;
  ulong __len;
  ulong uVar4;
  ulong uVar5;
  
  if (FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloc_skip_mmap == '\0')
  {
    if (pagesize == 0) {
      iVar1 = getpagesize();
      pagesize = (size_t)iVar1;
    }
    if (alignment < pagesize) {
      alignment = pagesize;
    }
    uVar5 = (size + alignment) - 1;
    pvVar2 = (void *)0x0;
    uVar5 = uVar5 - uVar5 % alignment;
    if (size <= uVar5) {
      if (actual_size != (size_t *)0x0) {
        *actual_size = uVar5;
      }
      pvVar2 = (void *)this->hint_;
      if ((uVar5 < (long)pvVar2 + uVar5) && (uVar4 = alignment - 1, ((ulong)pvVar2 & uVar4) == 0)) {
        pvVar2 = mmap(pvVar2,uVar5,3,0x22,-1,0);
        if ((uVar4 & (ulong)pvVar2) == 0) {
          this->hint_ = uVar5 + (long)pvVar2;
        }
        else {
          munmap(pvVar2,uVar5);
        }
        if ((uVar4 & (ulong)pvVar2) == 0) {
          return pvVar2;
        }
      }
      pvVar2 = (void *)0x0;
      uVar4 = alignment - pagesize;
      if (alignment < pagesize) {
        uVar4 = 0;
      }
      __addr = mmap((void *)0x0,uVar5 + uVar4,3,0x22,-1,0);
      if (__addr != (void *)0xffffffffffffffff) {
        uVar3 = alignment - 1 & (ulong)__addr;
        __len = alignment - uVar3;
        if (uVar3 == 0) {
          __len = 0;
        }
        if (__len != 0) {
          munmap(__addr,__len);
        }
        if (__len <= uVar4 && uVar4 - __len != 0) {
          munmap((void *)((long)__addr + uVar5 + __len),uVar4 - __len);
        }
        pvVar2 = (void *)(__len + (long)__addr);
        this->hint_ = uVar5 + (long)pvVar2;
      }
    }
  }
  else {
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

void* MmapSysAllocator::Alloc(size_t size, size_t *actual_size,
                              size_t alignment) {
#ifndef HAVE_MMAP
  return nullptr;
#else
  // Check if we should use mmap allocation.
  // FLAGS_malloc_skip_mmap starts out as false (its uninitialized
  // state) and eventually gets initialized to the specified value.  Note
  // that this code runs for a while before the flags are initialized.
  // Chances are we never get here before the flags are initialized since
  // sbrk is used until the heap is exhausted (before mmap is used).
  if (FLAGS_malloc_skip_mmap) {
    return nullptr;
  }

  // Enforce page alignment
  if (pagesize == 0) pagesize = getpagesize();
  if (alignment < pagesize) alignment = pagesize;
  size_t aligned_size = ((size + alignment - 1) / alignment) * alignment;
  if (aligned_size < size) {
    return nullptr;
  }
  size = aligned_size;

  // "actual_size" indicates that the bytes from the returned pointer
  // p up to and including (p + actual_size - 1) have been allocated.
  if (actual_size) {
    *actual_size = size;
  }

  if (hint_ && hint_ + size > size && (hint_ & (alignment - 1)) == 0) {
    // We try to 'continue' previous mapping. But we first check that
    // alignment requirements are met and that it won't overflow
    // address space.
    void* result = mmap(reinterpret_cast<void*>(hint_), size,
                        PROT_READ|PROT_WRITE,
                        MAP_PRIVATE|MAP_ANONYMOUS,
                        -1, 0);

    uintptr_t ptr = reinterpret_cast<uintptr_t>(result);

    // If the new mapping (even if at different address than hint
    // passed) requested alignment, then we return it.
    if ((ptr & (alignment - 1)) == 0) {
      hint_ = ptr + size;
      return result;
    }

    // Otherwise, we unmap and run "full" logic that is able to align
    // to arbitrary alignment. And that doesn't use hint.
    munmap(result, size);
  }

  // Ask for extra memory if alignment > pagesize
  size_t extra = 0;
  if (alignment > pagesize) {
    extra = alignment - pagesize;
  }

  // Note: size + extra does not overflow since:
  //            size + alignment < (1<<NBITS).
  // and        extra <= alignment
  // therefore  size + extra < (1<<NBITS)
  void* result = mmap(nullptr, size + extra,
                      PROT_READ|PROT_WRITE,
                      MAP_PRIVATE|MAP_ANONYMOUS,
                      -1, 0);
  if (result == reinterpret_cast<void*>(MAP_FAILED)) {
    return nullptr;
  }

  // Adjust the return memory so it is aligned
  uintptr_t ptr = reinterpret_cast<uintptr_t>(result);
  size_t adjust = 0;
  if ((ptr & (alignment - 1)) != 0) {
    adjust = alignment - (ptr & (alignment - 1));
  }

  // Return the unused memory to the system
  if (adjust > 0) {
    munmap(reinterpret_cast<void*>(ptr), adjust);
  }
  if (adjust < extra) {
    munmap(reinterpret_cast<void*>(ptr + adjust + size), extra - adjust);
  }

  ptr += adjust;
  hint_ = ptr + size;
  return reinterpret_cast<void*>(ptr);
#endif  // HAVE_MMAP
}